

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::ArgMaxFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  LogicalType *by_type;
  pointer by_type_00;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_2c9;
  LogicalType local_2c8;
  LogicalType local_2b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_298;
  vector<duckdb::LogicalType,_true> by_types;
  undefined1 local_150 [48];
  LogicalType local_120 [10];
  
  AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  LogicalType::LogicalType((LogicalType *)&by_types,INTEGER);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,int>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,BIGINT);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,long>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,DOUBLE);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,double>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,VARCHAR);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::string_t>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,DATE);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::date_t>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,TIMESTAMP);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::timestamp_t>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,TIMESTAMP_TZ);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::timestamp_t>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  LogicalType::LogicalType((LogicalType *)&by_types,BLOB);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::string_t>
            (in_RDI,(LogicalType *)&by_types);
  LogicalType::~LogicalType((LogicalType *)&by_types);
  ArgMaxByTypes();
  for (by_type_00 = by_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      by_type_00 !=
      by_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish; by_type_00 = by_type_00 + 1) {
    AddDecimalArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
              (in_RDI,by_type_00);
  }
  LogicalType::LogicalType((LogicalType *)local_150,ANY);
  AddVectorArgMinMaxFunctionBy<duckdb::VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>,duckdb::string_t>
            (in_RDI,(LogicalType *)local_150);
  LogicalType::~LogicalType((LogicalType *)local_150);
  AddGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
            (in_RDI);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&by_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  LogicalType::LogicalType((LogicalType *)local_150,ANY);
  LogicalType::LogicalType((LogicalType *)(local_150 + 0x18),ANY);
  LogicalType::LogicalType(local_120,BIGINT);
  __l._M_len = 3;
  __l._M_array = (iterator)local_150;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_298,__l,&local_2c9);
  LogicalType::LogicalType(&local_2c8,ANY);
  LogicalType::LIST(&local_2b0,&local_2c8);
  AggregateFunction::AggregateFunction
            ((AggregateFunction *)&by_types,(vector<duckdb::LogicalType,_true> *)&local_298,
             &local_2b0,(aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             ArgMinMaxNBind<duckdb::GreaterThan>,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_2b0);
  LogicalType::~LogicalType(&local_2c8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_298);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_150 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  AggregateFunction::AggregateFunction
            ((AggregateFunction *)local_150,(AggregateFunction *)&by_types);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions.
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             (AggregateFunction *)local_150);
  AggregateFunction::~AggregateFunction((AggregateFunction *)local_150);
  AggregateFunction::~AggregateFunction((AggregateFunction *)&by_types);
  return in_RDI;
}

Assistant:

AggregateFunctionSet ArgMaxFun::GetFunctions() {
	AggregateFunctionSet fun;
	AddArgMinMaxFunctions<GreaterThan, true, OrderType::DESCENDING>(fun);
	AddArgMinMaxNFunction<GreaterThan>(fun);
	return fun;
}